

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts5Iter * fts5MultiIterAlloc(Fts5Index *p,int nSeg)

{
  Fts5Iter *pFVar1;
  int local_24;
  int nSlot;
  Fts5Iter *pNew;
  int nSeg_local;
  Fts5Index *p_local;
  
  for (local_24 = 2; local_24 < nSeg; local_24 = local_24 << 1) {
  }
  pFVar1 = (Fts5Iter *)fts5IdxMalloc(p,(long)(local_24 + -1) * 0x78 + 0xd8 + (long)local_24 * 4);
  if (pFVar1 != (Fts5Iter *)0x0) {
    pFVar1->nSeg = local_24;
    pFVar1->aFirst = (Fts5CResult *)(pFVar1->aSeg + local_24);
    pFVar1->pIndex = p;
    pFVar1->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pFVar1;
}

Assistant:

static Fts5Iter *fts5MultiIterAlloc(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  int nSeg
){
  Fts5Iter *pNew;
  int nSlot;                      /* Power of two >= nSeg */

  for(nSlot=2; nSlot<nSeg; nSlot=nSlot*2);
  pNew = fts5IdxMalloc(p, 
      sizeof(Fts5Iter) +                  /* pNew */
      sizeof(Fts5SegIter) * (nSlot-1) +   /* pNew->aSeg[] */
      sizeof(Fts5CResult) * nSlot         /* pNew->aFirst[] */
  );
  if( pNew ){
    pNew->nSeg = nSlot;
    pNew->aFirst = (Fts5CResult*)&pNew->aSeg[nSlot];
    pNew->pIndex = p;
    pNew->xSetOutputs = fts5IterSetOutputs_Noop;
  }
  return pNew;
}